

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O3

int __thiscall
ModelWriter::fwrite_weight_tag_data(ModelWriter *this,Mat *data,FILE *bp,float a,float b)

{
  float fVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  size_t __n;
  uchar padding [4];
  int tag;
  Mat local_f8;
  Mat local_b0;
  undefined4 local_64;
  Option local_60;
  
  lVar3 = ftell((FILE *)bp);
  ncnn::Mat::reshape(&local_b0,data,data->h * data->w * data->d * data->c,(Allocator *)0x0);
  if (this->gen_random_weight != 0) {
    Randomize(&local_b0,a,b);
  }
  if (local_b0.elemsize == 1) {
    local_f8.data = (void *)CONCAT44(local_f8.data._4_4_,0xd4b38);
LAB_0015bc02:
    fwrite(&local_f8,4,1,(FILE *)bp);
    __n = (size_t)local_b0.w;
  }
  else {
    if (local_b0.elemsize == 2) {
      local_f8.data = (void *)CONCAT44(local_f8.data._4_4_,0x1306b47);
      goto LAB_0015bc02;
    }
    if (local_b0.elemsize != 4) {
      fprintf(_stderr,"unknown weight data type %d\n");
      goto LAB_0015bc2e;
    }
    if (this->storage_type == 1) {
      local_64 = 0x1306b47;
      fwrite(&local_64,4,1,(FILE *)bp);
      local_f8.cstep = 0;
      local_f8.data = (void *)0x0;
      local_f8.refcount._0_4_ = 0;
      local_f8.refcount._4_4_ = 0;
      local_f8.elemsize._0_4_ = 0;
      local_f8.elemsize._4_4_ = 0;
      local_f8.elempack = 0;
      local_f8.allocator = (Allocator *)0x0;
      local_f8.dims = 0;
      local_f8.w = 0;
      local_f8.h = 0;
      local_f8.d = 0;
      local_f8.c = 0;
      ncnn::Option::Option(&local_60);
      ncnn::cast_float32_to_float16(&local_b0,&local_f8,&local_60);
      fwrite(local_f8.data,CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize),
             (long)local_f8.w,(FILE *)bp);
      piVar2 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_f8.allocator == (Allocator *)0x0) {
            if (local_f8.data != (void *)0x0) {
              free(local_f8.data);
            }
          }
          else {
            (*(local_f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      goto LAB_0015bc2e;
    }
    local_f8.data = (void *)((ulong)local_f8.data._4_4_ << 0x20);
    fwrite(&local_f8,4,1,(FILE *)bp);
    __n = (size_t)local_b0.w;
    if (__n != 0) {
      sVar5 = 0;
      do {
        fVar1 = *(float *)((long)local_b0.data + sVar5 * 4);
        if ((ABS(fVar1) < 1e-30) && ((fVar1 != 0.0 || (NAN(fVar1))))) {
          *(undefined4 *)((long)local_b0.data + sVar5 * 4) = 0;
        }
        sVar5 = sVar5 + 1;
      } while (__n != sVar5);
    }
  }
  fwrite(local_b0.data,local_b0.elemsize,__n,(FILE *)bp);
LAB_0015bc2e:
  lVar4 = ftell((FILE *)bp);
  lVar3 = (long)((int)lVar4 - (int)lVar3);
  local_f8.data = (void *)((ulong)local_f8.data & 0xffffffff00000000);
  fwrite(&local_f8,1,(lVar3 + 3U & 0xfffffffffffffffc) - lVar3,(FILE *)bp);
  if (local_b0.refcount != (int *)0x0) {
    LOCK();
    *local_b0.refcount = *local_b0.refcount + -1;
    UNLOCK();
    if (*local_b0.refcount == 0) {
      if (local_b0.allocator == (Allocator *)0x0) {
        if (local_b0.data != (void *)0x0) {
          free(local_b0.data);
        }
      }
      else {
        (*(local_b0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int ModelWriter::fwrite_weight_tag_data(const ncnn::Mat& data, FILE* bp, float a, float b)
{
    int p0 = ftell(bp);

    ncnn::Mat data_flattened = data.reshape(data.w * data.h * data.d * data.c);
    if (gen_random_weight)
        Randomize(data_flattened, a, b);

    if (data_flattened.elemsize == 4)
    {
        if (storage_type == 1)
        {
            const int tag = 0x01306B47; // fp16 magic
            fwrite(&tag, sizeof(int), 1, bp);
            ncnn::Mat data_flattened_fp16;
            ncnn::cast_float32_to_float16(data_flattened, data_flattened_fp16);
            fwrite(data_flattened_fp16.data, data_flattened_fp16.elemsize, data_flattened_fp16.w, bp);
        }
        else
        {
            const int tag = 0; // fp32 magic
            fwrite(&tag, sizeof(int), 1, bp);
            replace_denormals_with_zero(data_flattened, data_flattened.w);
            fwrite(data_flattened.data, data_flattened.elemsize, data_flattened.w, bp);
        }
    }
    else if (data_flattened.elemsize == 2)
    {
        const int tag = 0x01306B47; // fp16 magic
        fwrite(&tag, sizeof(int), 1, bp);
        fwrite(data_flattened.data, data_flattened.elemsize, data_flattened.w, bp);
    }
    else if (data_flattened.elemsize == 1)
    {
        const int tag = 0x000D4B38; // int8 magic
        fwrite(&tag, sizeof(int), 1, bp);
        fwrite(data_flattened.data, data_flattened.elemsize, data_flattened.w, bp);
    }
    else
    {
        fprintf(stderr, "unknown weight data type %d\n", (int)data_flattened.elemsize);
    }

    // padding to 32bit align
    int nwrite = ftell(bp) - p0;
    size_t nalign = alignSize(nwrite, 4);
    unsigned char padding[4] = {0x00, 0x00, 0x00, 0x00};
    fwrite(padding, sizeof(unsigned char), nalign - nwrite, bp);

    return 0;
}